

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

void __thiscall
duckdb::DuckTransaction::PushSequenceUsage
          (DuckTransaction *this,SequenceCatalogEntry *sequence,SequenceData *data)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Hash_node_base *p_Var5;
  int64_t iVar6;
  int iVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __hash_code __code;
  UndoBufferReference undo_entry;
  UndoBufferReference local_50;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->sequence_lock);
  if (iVar7 == 0) {
    local_50.entry.ptr = (UndoBufferEntry *)sequence;
    p_Var8 = ::std::
             _Hashtable<std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::pair<const_std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::reference_wrapper<duckdb::SequenceValue>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::SequenceCatalogEntry>,_std::reference_wrapper<duckdb::SequenceValue>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::SequenceCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SequenceCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->sequence_usage)._M_h,
                        (ulong)sequence % (this->sequence_usage)._M_h._M_bucket_count,
                        (key_type *)&local_50,(__hash_code)sequence);
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var9 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var9 = p_Var8->_M_nxt;
    }
    if (p_Var9 == (_Hash_node_base *)0x0) {
      UndoBuffer::CreateEntry(&local_50,&this->undo_buffer,SEQUENCE_VALUE,0x18);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.handle.node);
      pdVar2 = (local_50.handle.node.ptr)->buffer;
      *(SequenceCatalogEntry **)(pdVar2 + local_50.position) = sequence;
      uVar3 = *(undefined4 *)((long)&data->usage_count + 4);
      iVar6 = data->counter;
      uVar4 = *(undefined4 *)((long)&data->counter + 4);
      pdVar1 = pdVar2 + local_50.position + 8;
      *(int *)pdVar1 = (int)data->usage_count;
      *(undefined4 *)(pdVar1 + 4) = uVar3;
      *(int *)(pdVar1 + 8) = (int)iVar6;
      *(undefined4 *)(pdVar1 + 0xc) = uVar4;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::SequenceCatalogEntry>,std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>,std::allocator<std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::SequenceCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SequenceCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<duckdb::SequenceCatalogEntry&,duckdb::SequenceValue&>
                ((_Hashtable<std::reference_wrapper<duckdb::SequenceCatalogEntry>,std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>,std::allocator<std::pair<std::reference_wrapper<duckdb::SequenceCatalogEntry>const,std::reference_wrapper<duckdb::SequenceValue>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::SequenceCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::SequenceCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->sequence_usage,sequence,pdVar2 + local_50.position);
      BufferHandle::~BufferHandle(&local_50.handle);
    }
    else {
      p_Var9 = p_Var9[2]._M_nxt;
      p_Var5 = (_Hash_node_base *)data->counter;
      p_Var9[1]._M_nxt = (_Hash_node_base *)data->usage_count;
      p_Var9[2]._M_nxt = p_Var5;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->sequence_lock);
    return;
  }
  ::std::__throw_system_error(iVar7);
}

Assistant:

void DuckTransaction::PushSequenceUsage(SequenceCatalogEntry &sequence, const SequenceData &data) {
	lock_guard<mutex> l(sequence_lock);
	auto entry = sequence_usage.find(sequence);
	if (entry == sequence_usage.end()) {
		auto undo_entry = undo_buffer.CreateEntry(UndoFlags::SEQUENCE_VALUE, sizeof(SequenceValue));
		auto sequence_info = reinterpret_cast<SequenceValue *>(undo_entry.Ptr());
		sequence_info->entry = &sequence;
		sequence_info->usage_count = data.usage_count;
		sequence_info->counter = data.counter;
		sequence_usage.emplace(sequence, *sequence_info);
	} else {
		auto &sequence_info = entry->second.get();
		D_ASSERT(RefersToSameObject(*sequence_info.entry, sequence));
		sequence_info.usage_count = data.usage_count;
		sequence_info.counter = data.counter;
	}
}